

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O1

errr visuals_file_parser_finish(parser *parser)

{
  long lVar1;
  uint8_t uVar2;
  long *plVar3;
  void *p;
  visuals_cycler *p_00;
  visuals_cycle_group **ppvVar4;
  visuals_cycle_group *p_01;
  visuals_color_cycle **ppvVar5;
  char *pcVar6;
  visuals_color_cycle *pvVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  
  p = parser_priv(parser);
  if (p == (void *)0x0) {
    visuals_cycler_table = (visuals_cycler *)0x0;
    goto LAB_001f2ea7;
  }
  sVar10 = 0xffffffffffffffff;
  lVar13 = 8;
  do {
    lVar13 = lVar13 + -8;
    lVar14 = sVar10 * 8;
    sVar10 = sVar10 + 1;
  } while (*(long *)(*(long *)((long)p + 0x30) + 8 + lVar14) != 0);
  if ((sVar10 == 0) || (p_00 = (visuals_cycler *)mem_zalloc(0x10), p_00 == (visuals_cycler *)0x0)) {
LAB_001f2c3b:
    p_00 = (visuals_cycler *)0x0;
  }
  else {
    ppvVar4 = (visuals_cycle_group **)mem_zalloc(-lVar13);
    p_00->groups = ppvVar4;
    if (ppvVar4 == (visuals_cycle_group **)0x0) {
      mem_free(p_00);
      goto LAB_001f2c3b;
    }
    p_00->max_groups = sVar10;
  }
  if (p_00 != (visuals_cycler *)0x0 && sVar10 != 0) {
    lVar13 = 0;
    sVar12 = 0;
    do {
      sVar16 = 0xffffffffffffffff;
      lVar14 = 8;
      do {
        lVar14 = lVar14 + -8;
        lVar1 = sVar16 * 8;
        sVar16 = sVar16 + 1;
      } while (*(long *)(*(long *)((long)p + 0x40) + lVar13 + 8 + lVar1) != 0);
      if (sVar16 == 0) {
LAB_001f2cf6:
        p_01 = (visuals_cycle_group *)0x0;
      }
      else {
        pcVar6 = *(char **)(*(long *)((long)p + 0x30) + sVar12 * 8);
        p_01 = (visuals_cycle_group *)mem_zalloc(0x18);
        if (p_01 == (visuals_cycle_group *)0x0) goto LAB_001f2cf6;
        ppvVar5 = (visuals_color_cycle **)mem_zalloc(-lVar14);
        p_01->cycles = ppvVar5;
        if (ppvVar5 == (visuals_color_cycle **)0x0) {
          mem_free(p_01);
          goto LAB_001f2cf6;
        }
        p_01->max_cycles = sVar16;
        pcVar6 = string_make(pcVar6);
        p_01->group_name = pcVar6;
      }
      if (p_01 == (visuals_cycle_group *)0x0) {
LAB_001f2e03:
        p_00 = (visuals_cycler *)0x0;
        break;
      }
      if (sVar16 != 0) {
        sVar11 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)p + 0x40) + sVar12 * 0x200 + sVar11 * 8);
          if (plVar3 == (long *)0x0) {
            pvVar7 = (visuals_color_cycle *)0x0;
          }
          else {
            if (plVar3[1] == 0) {
              uVar15 = 0;
            }
            else {
              uVar15 = 0;
              lVar14 = 0;
              do {
                uVar15 = uVar15 + (*(char *)(*plVar3 + lVar14) != (char)plVar3[3]);
                lVar14 = lVar14 + 1;
              } while (plVar3[1] != lVar14);
            }
            pvVar7 = visuals_color_cycle_new((char *)plVar3[2],uVar15,(uint8_t)plVar3[3]);
            if (pvVar7 == (visuals_color_cycle *)0x0) {
              pvVar7 = (visuals_color_cycle *)0x0;
            }
            else if ((uVar15 != 0) && (plVar3[1] != 0)) {
              uVar8 = 1;
              uVar9 = 0;
              do {
                uVar2 = *(uint8_t *)(*plVar3 + -1 + uVar8);
                if (uVar2 != (uint8_t)plVar3[3]) {
                  pvVar7->steps[uVar9] = uVar2;
                  uVar9 = uVar9 + 1;
                }
              } while ((uVar8 < (ulong)plVar3[1]) && (uVar8 = uVar8 + 1, uVar9 < uVar15));
            }
          }
          p_01->cycles[sVar11] = pvVar7;
          if (p_01->cycles[sVar11] == (visuals_color_cycle *)0x0) goto LAB_001f2e03;
          sVar11 = sVar11 + 1;
        } while (sVar16 != sVar11);
      }
      p_00->groups[sVar12] = p_01;
      sVar12 = sVar12 + 1;
      lVar13 = lVar13 + 0x200;
    } while (sVar10 != sVar12);
  }
  visuals_cycler_table = p_00;
  if (p != (void *)0x0) {
    if (*(long *)((long)p + 0x10) != 0) {
      if (*(long *)((long)p + 0x18) != 0) {
        uVar15 = 0;
        do {
          visuals_color_cycle_free
                    (*(visuals_color_cycle **)(*(long *)((long)p + 0x10) + uVar15 * 8));
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(ulong *)((long)p + 0x18));
      }
      mem_free(*(void **)((long)p + 0x10));
      *(undefined8 *)((long)p + 0x10) = 0;
    }
    if (*(long *)((long)p + 0x30) != 0) {
      if (*(long *)((long)p + 0x38) != 0) {
        uVar15 = 0;
        do {
          string_free(*(char **)(*(long *)((long)p + 0x30) + uVar15 * 8));
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(ulong *)((long)p + 0x38));
      }
      mem_free(*(void **)((long)p + 0x30));
      *(undefined8 *)((long)p + 0x30) = 0;
    }
    if (*(void **)((long)p + 0x40) != (void *)0x0) {
      mem_free(*(void **)((long)p + 0x40));
      *(undefined8 *)((long)p + 0x40) = 0;
    }
    mem_free(p);
  }
LAB_001f2ea7:
  parser_destroy(parser);
  return (uint)(visuals_cycler_table == (visuals_cycler *)0x0) * 5;
}

Assistant:

static errr visuals_file_parser_finish(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	visuals_cycler_table = visuals_parse_context_convert(context);
	visuals_parse_context_free(context);
	parser_destroy(parser);
	return (visuals_cycler_table == NULL) ? PARSE_ERROR_INTERNAL : PARSE_ERROR_NONE;
}